

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  uint uVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Rep *pRVar5;
  void **ppvVar6;
  string *psVar7;
  ulong unaff_RBX;
  undefined1 *puVar8;
  RepeatedPtrFieldBase *this_00;
  undefined8 unaff_R12;
  ulong uVar9;
  RepeatedPtrFieldBase *pRVar10;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R15;
  undefined1 auStack_50 [16];
  code *pcStack_40;
  undefined1 auStack_38 [24];
  
  puVar8 = auStack_38;
  if (start < 0) {
    pcStack_40 = (code *)0x2f21b0;
    RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  }
  else {
    unaff_RBX = (ulong)(uint)num;
    if (-1 < num) {
      this_00 = (RepeatedPtrFieldBase *)(ulong)(uint)(num + start);
      unaff_R15 = this;
      if (num + start <= (this->super_RepeatedPtrFieldBase).current_size_) {
        if (num != 0) {
          if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            ppvVar6 = (void **)this;
            if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pcStack_40 = (code *)0x2f2166;
              pRVar5 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
              ppvVar6 = pRVar5->elements;
            }
            pcStack_40 = (code *)0x2f217f;
            memcpy(elements,ppvVar6 + (uint)start,unaff_RBX << 3);
          }
          google::protobuf::internal::RepeatedPtrFieldBase::CloseGap((int)this,start);
          return;
        }
        return;
      }
      goto LAB_002f21bc;
    }
  }
  this_00 = (RepeatedPtrFieldBase *)(unaff_RBX & 0xffffffff);
  pcStack_40 = (code *)0x2f21bc;
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
LAB_002f21bc:
  pcStack_40 = internal::RepeatedPtrFieldBase::
               Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
  ;
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  uVar1 = this_00->current_size_;
  if ((int)uVar1 < 0) {
    puVar8 = auStack_50;
    this_00 = (RepeatedPtrFieldBase *)(ulong)uVar1;
    internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>();
  }
  else if (uVar1 == 0) {
    return;
  }
  *(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)(puVar8 + -8) = unaff_R15;
  *(ulong *)(puVar8 + -0x10) = (ulong)(uint)start;
  *(undefined8 *)(puVar8 + -0x18) = unaff_R12;
  *(ulong *)(puVar8 + -0x20) = unaff_RBX;
  uVar1 = this_00->current_size_;
  pRVar10 = this_00;
  if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
    *(undefined8 *)(puVar8 + -0x40) = 0x2f2206;
    pRVar5 = internal::RepeatedPtrFieldBase::rep(this_00);
    pRVar10 = (RepeatedPtrFieldBase *)pRVar5->elements;
  }
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      ppvVar6 = &pRVar10->tagged_rep_or_elem_ + uVar9;
      uVar9 = uVar9 + 1;
      pcVar2 = *(code **)(**ppvVar6 + 0x10);
      *(undefined8 *)(puVar8 + -0x40) = 0x2f2222;
      (*pcVar2)();
    } while (uVar1 != uVar9);
    this_00->current_size_ = 0;
    return;
  }
  *(undefined8 *)(puVar8 + -0x40) = 0x2f224b;
  psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)(int)uVar1,0,"n > 0");
  uVar3 = *(undefined8 *)psVar7;
  uVar4 = *(undefined8 *)(psVar7 + 8);
  *(undefined8 *)(puVar8 + -0x40) = 0x2f226b;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)(puVar8 + -0x30),
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,uVar4,uVar3);
  *(undefined8 *)(puVar8 + -0x40) = 0x2f2273;
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)(puVar8 + -0x30));
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}